

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.cpp
# Opt level: O3

string * __thiscall
llvm::to_hexString_abi_cxx11_
          (string *__return_storage_ptr__,llvm *this,uint64_t Value,bool UpperCase)

{
  FormattedNumber local_80;
  undefined1 local_68 [8];
  raw_string_ostream stream;
  string number;
  
  number._M_dataplus._M_p = (pointer)0x0;
  number._M_string_length._0_1_ = 0;
  stream.super_raw_ostream.OutBufCur._0_4_ = 1;
  stream.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
  stream.super_raw_ostream.OutBufStart = (char *)0x0;
  stream.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_68 = (undefined1  [8])&PTR__raw_string_ostream_010794b8;
  stream.super_raw_ostream._32_8_ = &stream.OS;
  local_80.DecValue = 0;
  local_80.Width = 1;
  local_80.Hex = true;
  local_80.Upper = SUB81(Value,0);
  local_80.HexPrefix = false;
  local_80.HexValue = (uint64_t)this;
  stream.OS = (string *)&number._M_string_length;
  raw_ostream::operator<<((raw_ostream *)local_68,&local_80);
  if ((_func_int **)stream.super_raw_ostream.OutBufEnd != stream.super_raw_ostream._vptr_raw_ostream
     ) {
    raw_ostream::flush_nonempty((raw_ostream *)local_68);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)stream.super_raw_ostream._32_8_,
             *(long *)(stream.super_raw_ostream._32_8_ + 8) +
             *(long *)stream.super_raw_ostream._32_8_);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_68);
  if (stream.OS != (string *)&number._M_string_length) {
    operator_delete(stream.OS,
                    CONCAT71(number._M_string_length._1_7_,(undefined1)number._M_string_length) + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string to_hexString(uint64_t Value, bool UpperCase) {
  std::string number;
  llvm::raw_string_ostream stream(number);
  stream << format_hex_no_prefix(Value, 1, UpperCase);
  return stream.str();
}